

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void ravi_pushcfastcall(lua_State *L,void *ptr,int tag)

{
  int iVar1;
  StkId pTVar2;
  int *piVar3;
  
  iVar1 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar1 + 1;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x23d,"void ravi_pushcfastcall(lua_State *, void *, int)");
  }
  if (0x7e < tag - 1U) {
    __assert_fail("tag >= 1 && tag < 0x80",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x23e,"void ravi_pushcfastcall(lua_State *, void *, int)");
  }
  pTVar2 = L->top;
  (pTVar2->value_).p = ptr;
  pTVar2->tt_ = (ushort)(tag << 8) | 0x46;
  pTVar2 = L->top;
  L->top = pTVar2 + 1;
  if (L->ci->top < pTVar2 + 1) {
    __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x23f,"void ravi_pushcfastcall(lua_State *, void *, int)");
  }
  piVar3 = *(int **)&L[-1].hookmask;
  *piVar3 = *piVar3 + -1;
  if (*piVar3 == 0) {
    return;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x240,"void ravi_pushcfastcall(lua_State *, void *, int)");
}

Assistant:

LUA_API void ravi_pushcfastcall(lua_State *L, void *ptr, int tag) {
  lua_lock(L);
  setfvalue_fastcall(L->top, ptr, tag);
  api_incr_top(L);
  lua_unlock(L);
}